

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinetic.c
# Opt level: O2

void cvode_kinetic(Item *qsol,Symbol *fun,int numeqn,int listnum)

{
  Item *pIVar1;
  short sVar2;
  int iVar3;
  List *pLVar4;
  char *pcVar5;
  Item *pIVar6;
  Item *pIVar7;
  
  if (done_list != (List *)0x0) {
    pLVar4 = done_list;
    pIVar1 = done_list->next;
    while (pIVar7 = pIVar1, pIVar7 != pLVar4) {
      pIVar1 = pIVar7->next;
      if ((Symbol *)(pIVar7->element).itm == fun) {
        delete(pIVar7);
        pLVar4 = done_list;
      }
    }
  }
  kinetic_intmethod(fun,"NEURON\'s CVode");
  lappendstr(procfunc,"\n/*CVODE ode begin*/\n");
  sprintf(buf,"static int _ode_spec%d() {_reset=0;{\n",(ulong)(uint)(fun->u).i);
  lappendstr(procfunc,buf);
  sprintf(buf,"static int _ode_spec%d(_threadargsproto_) {int _reset=0;{\n",(ulong)(uint)(fun->u).i)
  ;
  vectorize_substitute(procfunc->prev,buf);
  copyitems(cvode_sbegin,cvode_send,procfunc->prev);
  lappendstr(procfunc,"\n/*CVODE matsol*/\n");
  sprintf(buf,"static int _ode_matsol%d() {_reset=0;{\n",(ulong)(uint)(fun->u).i);
  lappendstr(procfunc,buf);
  sprintf(buf,
          "static int _ode_matsol%d(void* _so, double* _rhs, _threadargsproto_) {int _reset=0;{\n",
          (ulong)(uint)(fun->u).i);
  vectorize_substitute(procfunc->prev,buf);
  cvode_flag = 1;
  kinetic_implicit(fun,"dt","ZZZ");
  cvode_flag = 0;
  pIVar1 = procfunc->prev;
  copyitems(cvode_sbegin,cvode_send,pIVar1);
  pIVar7 = procfunc->prev;
LAB_0010e560:
  do {
    do {
      pIVar6 = pIVar1;
      if (pIVar6 == pIVar7) {
        lappendstr(procfunc,"\n/*CVODE end*/\n");
        return;
      }
      pIVar1 = pIVar6->next;
    } while (pIVar6->itemtype != 1);
    pcVar5 = ((pIVar6->element).sym)->name;
    iVar3 = strcmp(pcVar5,"f_flux");
  } while ((iVar3 != 0) && (iVar3 = strcmp(pcVar5,"b_flux"), iVar3 != 0));
  sVar2 = 1;
  do {
    if (sVar2 == 1) {
      if (*((pIVar6->element).sym)->name == ';') break;
    }
    else if ((sVar2 == 0x143) &&
            (pcVar5 = strchr((pIVar6->element).str,0x3b), pcVar5 != (char *)0x0)) break;
    pIVar6 = pIVar6->prev;
    sVar2 = pIVar6->itemtype;
  } while( true );
  pIVar6 = pIVar6->next;
  while ((pIVar6->itemtype != 1 || (*((pIVar6->element).sym)->name != ';'))) {
    pIVar1 = pIVar6->next;
    delete(pIVar6);
    pIVar6 = pIVar1;
  }
  pIVar1 = pIVar6->next;
  delete(pIVar6);
  goto LAB_0010e560;
}

Assistant:

void cvode_kinetic(qsol, fun, numeqn, listnum)
	Item* qsol;
	Symbol* fun;
	int numeqn, listnum;
{
#if 1
	Item* qn;
	int out;
	Item* q, *pbeg, *pend, *qnext;
	/* get a list of the original items so we can keep removing
	   the added ones to get back to the original list.
	*/
	if (done_list) for (q = done_list->next; q != done_list; q = qn) {
		qn = q->next;
		if (SYM(q) == fun) {
			delete(q);
		}
	}
	kinetic_intmethod(fun, "NEURON's CVode");
	Lappendstr(procfunc, "\n/*CVODE ode begin*/\n");
	sprintf(buf, "static int _ode_spec%d() {_reset=0;{\n", fun->u.i);
	Lappendstr(procfunc, buf);
	sprintf(buf, "static int _ode_spec%d(_threadargsproto_) {int _reset=0;{\n", fun->u.i);
	vectorize_substitute(procfunc->prev, buf);
	copyitems(cvode_sbegin, cvode_send, procfunc->prev);

	Lappendstr(procfunc, "\n/*CVODE matsol*/\n");
	sprintf(buf, "static int _ode_matsol%d() {_reset=0;{\n", fun->u.i);
	Lappendstr(procfunc, buf);
	sprintf(buf, "static int _ode_matsol%d(void* _so, double* _rhs, _threadargsproto_) {int _reset=0;{\n", fun->u.i);
	vectorize_substitute(procfunc->prev, buf);
	cvode_flag = 1;
	kinetic_implicit(fun, "dt", "ZZZ");
	cvode_flag = 0;
	pbeg = procfunc->prev;
	copyitems(cvode_sbegin, cvode_send, procfunc->prev);
	pend = procfunc->prev;
#if 1
	/* remove statements containing f_flux or b_flux */
	for (q = pbeg; q != pend; q = qnext) {
		qnext = q->next;
		if (q->itemtype == SYMBOL && 
		  (strcmp(SYM(q)->name, "f_flux") == 0 || 
		   strcmp(SYM(q)->name, "b_flux") == 0 )) {
		  
			/* find the beginning of the statement */
			out = 0;
			for (;;) {
				switch(q->itemtype) {
				case STRING:
					if (strchr(STR(q), ';')) {
						out = 1;
					}
					break;
				case SYMBOL:
					if (SYM(q)->name[0] == ';') {
						out = 1;
					}
					break;
				}
				if (out) {
					break;
				}
				q = q->prev;
			}
			q = q->next;
			/* delete the statement */
			while (q->itemtype != SYMBOL || SYM(q)->name[0] != ';') {
				qnext = q->next;
				delete(q);
				q = qnext;
			}
			qnext = q->next;
			delete(q);
		}
	}
#endif
	Lappendstr(procfunc, "\n/*CVODE end*/\n");

#endif
}